

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O0

void __thiscall
writer_test_should_write_int_field_Test::~writer_test_should_write_int_field_Test
          (writer_test_should_write_int_field_Test *this)

{
  writer_test_should_write_int_field_Test *this_local;
  
  ~writer_test_should_write_int_field_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(writer_test, should_write_int_field)
{
    using Field = Fixpp::Field<Fixpp::Tag::MsgSeqNum>;
    Field field;
    field.set(25);

    std::ostringstream oss;
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "34=25|");
}